

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void Id_DsdManTuneStr1(If_DsdMan_t *p,char *pStruct,int nConfls,int fVerbose)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Ifn_Ntk_t *p_01;
  char *pcVar5;
  void *pvVar6;
  Vec_Wrd_t *pVVar7;
  ProgressBar *p_02;
  word *pTruth;
  word *pConfig;
  abctime aVar8;
  word extraout_RDX;
  word extraout_RDX_00;
  word extraout_RDX_01;
  word Fill;
  word extraout_RDX_02;
  char *pString;
  abctime time;
  int iVar9;
  
  aVar4 = Abc_Clock();
  p_01 = Ifn_NtkParse(pStruct);
  if (p_01 != (Ifn_Ntk_t *)0x0) {
    iVar9 = p->nVars;
    iVar1 = Ifn_NtkInputNum(p_01);
    if (iVar1 < iVar9) {
      uVar3 = p->nVars;
      uVar2 = Ifn_NtkInputNum(p_01);
      printf("The support of DSD manager (%d) exceeds the support of the structure (%d).\n",
             (ulong)uVar3,(ulong)uVar2);
    }
    else {
      if (p->pCellStr != (char *)0x0) {
        free(p->pCellStr);
        p->pCellStr = (char *)0x0;
      }
      pcVar5 = Abc_UtilStrsav(pStruct);
      p->pCellStr = pcVar5;
      iVar9 = p->nVars;
      iVar1 = Ifn_NtkInputNum(p_01);
      if (iVar9 < iVar1) {
        uVar3 = p->nVars;
        uVar2 = Ifn_NtkInputNum(p_01);
        printf("Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n"
               ,(ulong)uVar3,(ulong)uVar2);
      }
      uVar3 = Ifn_NtkLutSizeMax(p_01);
      uVar2 = Ifn_NtkTtBits(pStruct);
      p->nTtBits = uVar2;
      p->nConfigWords = (((int)uVar2 >> 6) - (uint)((uVar2 & 0x3f) == 0)) + 2;
      Fill = extraout_RDX;
      if (fVerbose != 0) {
        printf("Considering programmable cell: ");
        Ifn_NtkPrint(p_01);
        printf("Largest LUT size = %d.\n",(ulong)uVar3);
        Fill = extraout_RDX_00;
      }
      if (0 < p->nObjsPrev) {
        printf("Starting the tuning process from object %d (out of %d).\n",(ulong)(uint)p->nObjsPrev
               ,(ulong)(uint)(p->vObjs).nSize);
        Fill = extraout_RDX_01;
      }
      p_00 = &p->vObjs;
      for (iVar9 = 0; iVar1 = (p->vObjs).nSize, iVar9 < iVar1; iVar9 = iVar9 + 1) {
        pvVar6 = Vec_PtrEntry(p_00,iVar9);
        if (p->nObjsPrev <= iVar9) {
          *(byte *)((long)pvVar6 + 5) = *(byte *)((long)pvVar6 + 5) & 0xfe;
        }
        Fill = extraout_RDX_02;
      }
      iVar1 = iVar1 * p->nConfigWords;
      if (p->vConfigs == (Vec_Wrd_t *)0x0) {
        pVVar7 = Vec_WrdStart(iVar1);
        p->vConfigs = pVVar7;
      }
      else {
        Vec_WrdFillExtra(p->vConfigs,iVar1,Fill);
      }
      p_02 = Extra_ProgressBarStart(_stdout,(p->vObjs).nSize);
      for (uVar3 = p->nObjsPrev; (int)uVar3 < (p->vObjs).nSize; uVar3 = uVar3 + 1) {
        pvVar6 = Vec_PtrEntry(p_00,uVar3);
        if ((char)uVar3 == '\0') {
          Extra_ProgressBarUpdate(p_02,uVar3,pString);
        }
        uVar2 = *(uint *)((long)pvVar6 + 4) >> 3 & 0x1f;
        iVar9 = Abc_Var2Lit(uVar3,0);
        pTruth = If_DsdManComputeTruth(p,iVar9,(uchar *)0x0);
        if (fVerbose != 0) {
          printf("%6d : %2d ",(ulong)uVar3,(ulong)uVar2);
        }
        pConfig = Vec_WrdEntryP(p->vConfigs,p->nConfigWords * uVar3);
        iVar9 = Ifn_NtkMatch(p_01,pTruth,uVar2,nConfls,fVerbose,0,pConfig);
        if (iVar9 == 0) {
          If_DsdVecObjSetMark(p_00,uVar3);
          memset(pConfig,0,(long)p->nConfigWords << 3);
        }
      }
      p->nObjsPrev = 0;
      p->LutSize = 0;
      Extra_ProgressBarStop(p_02);
      printf("Finished matching %d functions. ",(ulong)(uint)(p->vObjs).nSize);
      aVar8 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar8 - aVar4),time);
    }
    free(p_01);
    return;
  }
  return;
}

Assistant:

void Id_DsdManTuneStr1( If_DsdMan_t * p, char * pStruct, int nConfls, int fVerbose )
{
    int fVeryVerbose = 0;
    ProgressBar * pProgress = NULL;
    If_DsdObj_t * pObj;
    word * pTruth, * pConfig;
    int i, nVars, Value, LutSize;
    abctime clk = Abc_Clock();
    // parse the structure
    Ifn_Ntk_t * pNtk = Ifn_NtkParse( pStruct );
    if ( pNtk == NULL )
        return;
    if ( If_DsdManVarNum(p) > Ifn_NtkInputNum(pNtk) )
    {
        printf( "The support of DSD manager (%d) exceeds the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
        ABC_FREE( pNtk );
        return;
    }
    ABC_FREE( p->pCellStr );
    p->pCellStr = Abc_UtilStrsav( pStruct );
    if ( If_DsdManVarNum(p) < Ifn_NtkInputNum(pNtk) )
        printf( "Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
    LutSize = Ifn_NtkLutSizeMax(pNtk);
    p->nTtBits = Ifn_NtkTtBits( pStruct );
    p->nConfigWords = 1 + Abc_Bit6WordNum( p->nTtBits );
    // print
    if ( fVerbose )
    {
        printf( "Considering programmable cell: " );
        Ifn_NtkPrint( pNtk );
        printf( "Largest LUT size = %d.\n", LutSize );
    }
    if ( p->nObjsPrev > 0 )
        printf( "Starting the tuning process from object %d (out of %d).\n", p->nObjsPrev, Vec_PtrSize(&p->vObjs) );
    // clean the attributes
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        if ( i >= p->nObjsPrev )
            pObj->fMark = 0;
    if ( p->vConfigs == NULL )
        p->vConfigs = Vec_WrdStart( p->nConfigWords * Vec_PtrSize(&p->vObjs) );
    else
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs), 0 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(&p->vObjs) );
    If_DsdVecForEachObjStart( &p->vObjs, pObj, i, p->nObjsPrev )
    {
        if ( (i & 0xFF) == 0 )
            Extra_ProgressBarUpdate( pProgress, i, NULL );
        nVars = If_DsdObjSuppSize(pObj);
        //if ( nVars <= LutSize )
        //    continue;
        pTruth = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( pTruth, nVars );
        if ( fVerbose )
            printf( "%6d : %2d ", i, nVars );
        pConfig = Vec_WrdEntryP( p->vConfigs, p->nConfigWords * i );
        Value = Ifn_NtkMatch( pNtk, pTruth, nVars, nConfls, fVerbose, fVeryVerbose, pConfig );
        if ( fVeryVerbose )
            printf( "\n" );
        if ( Value == 0 )
        {
            If_DsdVecObjSetMark( &p->vObjs, i );
            memset( pConfig, 0, sizeof(word) * p->nConfigWords );
        }
    }
    p->nObjsPrev = 0;
    p->LutSize = 0;
    Extra_ProgressBarStop( pProgress );
    printf( "Finished matching %d functions. ", Vec_PtrSize(&p->vObjs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        If_DsdManPrintDistrib( p );
    ABC_FREE( pNtk );
}